

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smoke_test.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  list<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  *this;
  SaveBlock save;
  LoadBlock load_;
  bool bVar1;
  _Manager_type p_Var2;
  Link *l;
  vector<int,_std::allocator<int>_> *this_00;
  uint uVar3;
  int iVar4;
  uint j;
  int iVar5;
  _Invoker_type in_stack_ffffffffffffe5e8;
  undefined7 uStack_1a10;
  bool help;
  int nblocks;
  undefined1 auStack_1a04 [12];
  _Head_base<0UL,_opts::BasicOption_*,_false> local_19f8;
  _Head_base<0UL,_opts::BasicOption_*,_false> in_stack_ffffffffffffe610;
  _Head_base<0UL,_opts::BasicOption_*,_false> q_policy;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_19e8;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_19e0;
  _Head_base<0UL,_opts::BasicOption_*,_false> local_19d8;
  int in_memory;
  int threads;
  environment env;
  string local_19c0;
  communicator world;
  vector<int,_std::allocator<int>_> gids;
  BlockID neighbor;
  code *local_1918 [2];
  code *local_1908;
  code *local_1900;
  code *local_18f8 [2];
  code *local_18e8;
  code *local_18e0;
  code *local_18d8 [2];
  code *local_18c8;
  code *local_18c0;
  code *local_18b8 [2];
  code *local_18a8;
  code *local_18a0;
  RoundRobinAssigner assigner;
  communicator local_1878;
  string local_1860;
  string prefix;
  string local_1820;
  string local_1800;
  string local_17e0;
  string local_17c0;
  Options ops;
  _Any_data local_1768;
  undefined8 local_1758;
  undefined8 uStack_1750;
  FileStorage storage;
  _Any_data local_16c8;
  code *local_16b8;
  code *local_16b0;
  undefined8 local_16a8;
  undefined8 uStack_16a0;
  code *local_1698;
  code *local_1690;
  undefined8 local_1688;
  undefined8 uStack_1680;
  code *local_1678;
  code *local_1670;
  Master master;
  
  diy::mpi::environment::environment(&env,argc,argv);
  diy::mpi::communicator::communicator(&world);
  nblocks = 0x80;
  threads = 4;
  in_memory = 8;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&prefix,"./DIY.XXXXXX",(allocator<char> *)&master);
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&ops;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  this = &ops.options;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node._M_size = 0;
  ops.failed = false;
  ops.args.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       ops.args.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this;
  ops.options.
  super__List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&master,"blocks",(allocator<char> *)(auStack_1a04 + 0xb));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&storage,"number of blocks",(allocator<char> *)(auStack_1a04 + 10));
  opts::Option<int>((opts *)&local_19d8,'b',(string *)&master,&nblocks,(string *)&storage);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_19d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&neighbor,"thread",(allocator<char> *)(auStack_1a04 + 9));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_19c0,"number of threads",(allocator<char> *)(auStack_1a04 + 8));
  opts::Option<int>((opts *)&local_19e0,'t',(string *)&neighbor,&threads,&local_19c0);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_19e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gids,"memory",(allocator<char> *)(auStack_1a04 + 7));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&assigner,"maximum blocks to store in memory",
             (allocator<char> *)(auStack_1a04 + 6));
  opts::Option<int>((opts *)&local_19e8,'m',(string *)&gids,&in_memory,(string *)&assigner);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_19e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1860,"prefix",(allocator<char> *)(auStack_1a04 + 5));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_17c0,"prefix for external storage",
             (allocator<char> *)(auStack_1a04 + 4));
  opts::Option<std::__cxx11::string>
            ((opts *)&stack0xffffffffffffe610,&local_1860,&prefix,&local_17c0);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &stack0xffffffffffffe610);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_17e0,"help",(allocator<char> *)(auStack_1a04 + 3));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1800,"show help",(allocator<char> *)(auStack_1a04 + 2));
  opts::Option<bool>((opts *)&local_19f8,'h',&local_17e0,&help,&local_1800);
  std::__cxx11::
  list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
  ::emplace_back<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>
            ((list<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>,std::allocator<std::unique_ptr<opts::BasicOption,std::default_delete<opts::BasicOption>>>>
              *)this,(unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
                     &local_19f8);
  if (local_19f8._M_head_impl != (BasicOption *)0x0) {
    (*(local_19f8._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_19f8._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_1800);
  std::__cxx11::string::~string((string *)&local_17e0);
  if ((_Head_base<0UL,_opts::BasicOption_*,_false>)in_stack_ffffffffffffe610._M_head_impl !=
      (_Head_base<0UL,_opts::BasicOption_*,_false>)0x0) {
    (*(in_stack_ffffffffffffe610._M_head_impl)->_vptr_BasicOption[1])();
  }
  q_policy._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_17c0);
  std::__cxx11::string::~string((string *)&local_1860);
  if (local_19e8._M_head_impl != (BasicOption *)0x0) {
    (*(local_19e8._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_19e8._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&assigner);
  std::__cxx11::string::~string((string *)&gids);
  if (local_19e0._M_head_impl != (BasicOption *)0x0) {
    (*(local_19e0._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_19e0._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&local_19c0);
  std::__cxx11::string::~string((string *)&neighbor);
  if (local_19d8._M_head_impl != (BasicOption *)0x0) {
    (*(local_19d8._M_head_impl)->_vptr_BasicOption[1])();
  }
  local_19d8._M_head_impl = (BasicOption *)0x0;
  std::__cxx11::string::~string((string *)&storage);
  std::__cxx11::string::~string((string *)&master);
  bVar1 = opts::Options::parse(&ops,argc,argv);
  if ((bVar1) && (help != true)) {
    diy::FileStorage::FileStorage(&storage,&prefix);
    iVar5 = threads;
    iVar4 = in_memory;
    local_1878.comm_.data = world.comm_.data;
    local_1878.owner_ = false;
    local_18b8[1] = (code *)0x0;
    local_18b8[0] = create_block;
    local_18a0 = std::_Function_handler<void_*(),_void_*(*)()>::_M_invoke;
    local_18a8 = std::_Function_handler<void_*(),_void_*(*)()>::_M_manager;
    local_18d8[1] = (code *)0x0;
    local_18d8[0] = destroy_block;
    local_18c0 = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_invoke;
    local_18f8[1] = (code *)0x0;
    local_18c8 = std::_Function_handler<void_(void_*),_void_(*)(void_*)>::_M_manager;
    local_18f8[0] = save_block;
    local_18e0 = std::
                 _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
                 ::_M_invoke;
    local_1918[1] = (code *)0x0;
    local_18e8 = std::
                 _Function_handler<void_(const_void_*,_diy::BinaryBuffer_&),_void_(*)(const_void_*,_diy::BinaryBuffer_&)>
                 ::_M_manager;
    local_1918[0] = load_block;
    local_1900 = std::
                 _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
                 ::_M_invoke;
    local_1908 = std::
                 _Function_handler<void_(void_*,_diy::BinaryBuffer_&),_void_(*)(void_*,_diy::BinaryBuffer_&)>
                 ::_M_manager;
    p_Var2 = (_Manager_type)operator_new(0x10);
    *(undefined ***)p_Var2 = &PTR_unload_incoming_00146390;
    *(undefined8 *)(p_Var2 + 8) = 0x1000;
    save.super__Function_base._M_functor._8_8_ = local_1918;
    save.super__Function_base._M_functor._M_unused._M_object = local_18f8;
    save.super__Function_base._M_manager = p_Var2;
    save._M_invoker = in_stack_ffffffffffffe5e8;
    load_.super__Function_base._M_functor._M_pod_data[7] = help;
    load_.super__Function_base._M_functor._0_7_ = uStack_1a10;
    load_.super__Function_base._M_functor._8_4_ = nblocks;
    load_.super__Function_base._12_12_ = auStack_1a04;
    load_._M_invoker = (_Invoker_type)local_19f8._M_head_impl;
    diy::Master::Master(&master,&local_1878,iVar5,iVar4,(CreateBlock *)local_18b8,
                        (DestroyBlock *)local_18d8,&storage.super_ExternalStorage,save,load_,
                        (QueuePolicy *)q_policy._M_head_impl);
    std::_Function_base::~_Function_base((_Function_base *)local_1918);
    std::_Function_base::~_Function_base((_Function_base *)local_18f8);
    std::_Function_base::~_Function_base((_Function_base *)local_18d8);
    std::_Function_base::~_Function_base((_Function_base *)local_18b8);
    diy::mpi::communicator::~communicator(&local_1878);
    assigner.super_StaticAssigner.super_Assigner.size_ = world.size_;
    assigner.super_StaticAssigner.super_Assigner.nblocks_ = nblocks;
    assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
         (_func_int **)&PTR__Assigner_001463e8;
    gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    diy::RoundRobinAssigner::local_gids(&assigner,world.rank_,&gids);
    uVar3 = 0;
    while( true ) {
      if ((ulong)((long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= (ulong)uVar3) break;
      iVar4 = gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar3];
      l = (Link *)operator_new(0x20);
      (l->super_Factory<diy::Link>)._vptr_Factory = (_func_int **)&PTR_id_abi_cxx11__00146468;
      (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (iVar4 < nblocks + -1) {
        neighbor.proc = (iVar4 + 1) % assigner.super_StaticAssigner.super_Assigner.size_;
        neighbor.gid = iVar4 + 1;
        std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::push_back
                  (&l->neighbors_,&neighbor);
      }
      if (0 < iVar4) {
        neighbor.proc = (iVar4 + -1) % assigner.super_StaticAssigner.super_Assigner.size_;
        neighbor.gid = iVar4 + -1;
        std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::push_back
                  (&l->neighbors_,&neighbor);
      }
      this_00 = (vector<int,_std::allocator<int>_> *)operator_new(0x20);
      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      for (iVar5 = 0; iVar5 != 3; iVar5 = iVar5 + 1) {
        local_19c0._M_dataplus._M_p._0_4_ = iVar4 * 3 + iVar5;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,(int *)&local_19c0);
      }
      diy::Master::add(&master,iVar4,this_00,l);
      uVar3 = uVar3 + 1;
    }
    local_19c0._M_dataplus._M_p = (pointer)local_sum;
    neighbor.gid = 0;
    neighbor.proc = 0;
    diy::Master::foreach<void(*)(Block*,diy::Master::ProxyWithLink_const&)>
              (&master,(_func_void_Block_ptr_ProxyWithLink_ptr **)&local_19c0,(Skip *)&neighbor);
    std::_Function_base::~_Function_base((_Function_base *)&neighbor);
    local_16c8._M_unused._M_object = (void *)0x0;
    local_16c8._8_8_ = 0;
    local_16b0 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_invoke;
    local_16b8 = std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_manager;
    local_16a8 = 0;
    uStack_16a0 = 0;
    local_1690 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_invoke;
    local_1698 = std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_manager;
    local_1688 = 0;
    uStack_1680 = 0;
    local_1670 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_invoke;
    local_1678 = std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_manager;
    diy::Master::exchange(&master,false,(MemoryManagement *)&local_16c8);
    diy::MemoryManagement::~MemoryManagement((MemoryManagement *)&local_16c8);
    local_19c0._M_dataplus._M_p = (pointer)average_neighbors;
    neighbor.gid = 0;
    neighbor.proc = 0;
    diy::Master::foreach<void(*)(Block*,diy::Master::ProxyWithLink_const&)>
              (&master,(_func_void_Block_ptr_ProxyWithLink_ptr **)&local_19c0,(Skip *)&neighbor);
    std::_Function_base::~_Function_base((_Function_base *)&neighbor);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_19c0,"blocks.out",(allocator<char> *)&local_1860);
    neighbor = (BlockID)&PTR__MemoryBuffer_00146560;
    local_1768._M_unused._M_object = (void *)0x0;
    local_1768._8_8_ = 0;
    local_1758 = 0;
    uStack_1750 = 0;
    diy::io::write_blocks
              (&local_19c0,&world,&master,(MemoryBuffer *)&neighbor,(SaveBlock *)&local_1768);
    std::_Function_base::~_Function_base((_Function_base *)&local_1768);
    diy::MemoryBuffer::~MemoryBuffer((MemoryBuffer *)&neighbor);
    std::__cxx11::string::~string((string *)&local_19c0);
    if (world.rank_ == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1820,"",(allocator<char> *)&neighbor);
      diy::stats::Profiler::output(&master.prof,(ostream *)&std::cout,&local_1820);
      std::__cxx11::string::~string((string *)&local_1820);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&gids.super__Vector_base<int,_std::allocator<int>_>);
    diy::Master::~Master(&master);
    diy::FileStorage::~FileStorage(&storage);
    iVar4 = 0;
  }
  else {
    iVar4 = 1;
    if (world.rank_ == 0) {
      opts::operator<<((ostream *)&std::cout,&ops);
    }
  }
  opts::Options::~Options(&ops);
  std::__cxx11::string::~string((string *)&prefix);
  diy::mpi::communicator::~communicator(&world);
  diy::mpi::environment::~environment(&env);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[])
{
    diy::mpi::environment     env(argc, argv); // equivalent of MPI_Init(argc, argv)/MPI_Finalize()
    diy::mpi::communicator    world;           // equivalent of MPI_COMM_WORLD

    int                       nblocks   = 128; // global number of blocks
    int                       threads   = 4;   // allow diy 4 threads for multithreading blocks
    int                       in_memory = 8;   // allow diy to keep 8 local blocks in memory
    std::string               prefix    = "./DIY.XXXXXX"; // prefix for temp files for blocks
                                                          // moved out of core

    bool help;

    // get command line arguments
    using namespace opts;
    Options ops;
    ops
        >> Option('b', "blocks",  nblocks,        "number of blocks")
        >> Option('t', "thread",  threads,        "number of threads")
        >> Option('m', "memory",  in_memory,      "maximum blocks to store in memory")
        >> Option(     "prefix",  prefix,         "prefix for external storage")
        >> Option('h', "help",    help,           "show help")
        ;
    if (!ops.parse(argc,argv) || help)
    {
        if (world.rank() == 0)
            std::cout << ops;
        return 1;
    }

    // diy initialization
    diy::FileStorage          storage(prefix); // used for blocks to be moved out of core
    diy::Master               master(world,    // master is the diy top-level object
                                     threads,
                                     in_memory,
                                     &create_block,
                                     &destroy_block,
                                     &storage,
                                     &save_block,
                                     &load_block);

    // choice of contiguous or round robin assigner
    // diy::ContiguousAssigner   assigner(world.size(), nblocks);
    diy::RoundRobinAssigner   assigner(world.size(), nblocks);

    // this example creates a linear chain of blocks
    std::vector<int> gids;                     // global ids of local blocks
    assigner.local_gids(world.rank(), gids);   // get the gids of local blocks
    for (unsigned i = 0; i < gids.size(); ++i) // for the local blocks in this processor
    {
        int gid = gids[i];

        diy::Link*    link = new diy::Link;  // link is this block's neighborhood
        diy::BlockID  neighbor;
        if (gid < nblocks - 1)               // all but the last block in the global domain
        {
            neighbor.gid  = gid + 1;                     // gid of the neighbor block
            neighbor.proc = assigner.rank(neighbor.gid); // process of the neighbor block
            link->add_neighbor(neighbor);                // add the neighbor block to the link
        }
        if (gid > 0)                         // all but the first block in the global domain
        {
            neighbor.gid  = gid - 1;
            neighbor.proc = assigner.rank(neighbor.gid);
            link->add_neighbor(neighbor);
        }

        Block* b = new Block;                // create a new block
        // assign some values for the block
        // in this example, simply based on the block global id
        for (unsigned j = 0; j < 3; ++j)
            b->values.push_back(gid * 3 + j);

        master.add(gid, b, link);            // add the current local block to the master
    }

    // compute, exchange, compute
    master.foreach(&local_sum);          // callback function executed on each local block
    master.exchange();                   // exchange data between blocks in the link
    master.foreach(&average_neighbors);  // callback function executed on each local block

    // save the results in diy format
    diy::io::write_blocks("blocks.out", world, master);

    if (world.rank() == 0)
        master.prof.output(std::cout);
}